

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

char * __thiscall cmSourceFile::GetPropertyForUser(cmSourceFile *this,string *prop)

{
  __type _Var1;
  char *pcVar2;
  string *prop_local;
  cmSourceFile *this_local;
  
  _Var1 = std::operator==(prop,&propLOCATION_abi_cxx11_);
  if (_Var1) {
    GetFullPath(this,(string *)0x0);
  }
  pcVar2 = GetProperty(this,prop);
  return pcVar2;
}

Assistant:

const char* cmSourceFile::GetPropertyForUser(const std::string& prop)
{
  // This method is a consequence of design history and backwards
  // compatibility.  GetProperty is (and should be) a const method.
  // Computed properties should not be stored back in the property map
  // but instead reference information already known.  If they need to
  // cache information in a mutable ivar to provide the return string
  // safely then so be it.
  //
  // The LOCATION property is particularly problematic.  The CMake
  // language has very loose restrictions on the names that will match
  // a given source file (for historical reasons).  Implementing
  // lookups correctly with such loose naming requires the
  // cmSourceFileLocation class to commit to a particular full path to
  // the source file as late as possible.  If the users requests the
  // LOCATION property we must commit now.
  if (prop == propLOCATION) {
    // Commit to a location.
    this->GetFullPath();
  }

  // Perform the normal property lookup.
  return this->GetProperty(prop);
}